

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  iterator *piVar1;
  iterator *piVar2;
  FieldDescriptor *pFVar3;
  iterator *piVar4;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  undefined1 uVar5;
  undefined8 in_RCX;
  _Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
  __comp;
  iterator *piVar6;
  long extraout_RDX;
  FieldDescriptor **ppFVar7;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __first;
  long __depth_limit;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  _Var8;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  _Var9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  _Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
  _Stack_48;
  _Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
  _Stack_40;
  
  piVar1 = (iterator *)a->ctrl_;
  __comp._M_comp =
       (_func_bool_FieldDescriptor_ptr_FieldDescriptor_ptr *)
       CONCAT71((int7)((ulong)in_RCX >> 8),piVar1 == (iterator *)0x0);
  if ((piVar1 == (iterator *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       piVar1 == (iterator *)0x0) || (-1 < (char)*(code *)&piVar1->ctrl_)) {
    __comp._M_comp = (_func_bool_FieldDescriptor_ptr_FieldDescriptor_ptr *)b->ctrl_;
    if ((__comp._M_comp == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>
         || (iterator *)__comp._M_comp == (iterator *)0x0) ||
       (-1 < (char)*(code *)&((iterator *)__comp._M_comp)->ctrl_)) {
      if (piVar1 == (iterator *)
                    absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
          __comp._M_comp == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>
         ) {
LAB_0031e30b:
        return piVar1 == (iterator *)__comp._M_comp;
      }
      if ((piVar1 ==
          (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) !=
          (__comp._M_comp ==
          absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>))
      goto LAB_0031e327;
      if (piVar1 == (iterator *)0x0 || (iterator *)__comp._M_comp == (iterator *)0x0)
      goto LAB_0031e30b;
      if (((iterator *)__comp._M_comp == (iterator *)&kSooControl) ==
          (piVar1 == (iterator *)&kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        piVar2 = (iterator *)(b->field_1).slot_;
        if (piVar1 == (iterator *)&kSooControl) {
          if (a == piVar2) goto LAB_0031e30b;
        }
        else {
          piVar6 = piVar2;
          piVar4 = (iterator *)__comp._M_comp;
          b = a;
          if (__comp._M_comp < piVar1) {
            piVar6 = a;
            piVar4 = piVar1;
            b = piVar2;
          }
          if ((piVar4 < b) && (b <= piVar6)) goto LAB_0031e30b;
        }
      }
      operator==();
      goto LAB_0031e31d;
    }
  }
  else {
LAB_0031e31d:
    operator==();
  }
  operator==();
LAB_0031e327:
  operator==();
  uVar10 = (long)b - (long)a >> 3;
  uVar5 = extraout_AL;
  if (0x10 < (long)uVar10) {
    __depth_limit = extraout_RDX;
    do {
      bVar12 = __depth_limit == 0;
      __depth_limit = __depth_limit + -1;
      if (bVar12) {
        _Stack_48._M_comp = __comp._M_comp;
        _Stack_40._M_comp = __comp._M_comp;
        std::
        __make_heap<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
                  ((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    )a,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                        )b,&_Stack_40);
        std::
        __sort_heap<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
                  ((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    )a,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                        )b,&_Stack_48);
        return (bool)extraout_AL_01;
      }
      std::
      __move_median_to_first<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
                ((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  )a,(FieldDescriptor **)((long)a + 8),
                 (FieldDescriptor **)((long)a + (uVar10 & 0xfffffffffffffffe) * 4),
                 (FieldDescriptor **)((long)b + -8),__comp);
      _Var8._M_current = (FieldDescriptor **)b;
      _Var9._M_current = (FieldDescriptor **)((long)a + 8);
      while( true ) {
        lVar11 = (-8 - (long)a) + (long)_Var9._M_current;
        __first._M_current = _Var9._M_current + -1;
        do {
          ppFVar7 = __first._M_current;
          __first._M_current = ppFVar7 + 1;
          bVar12 = (*__comp._M_comp)(ppFVar7[1],*(FieldDescriptor **)a);
          lVar11 = lVar11 + 8;
        } while (bVar12);
        _Var9._M_current = ppFVar7 + 2;
        do {
          ppFVar7 = _Var8._M_current + -1;
          _Var8._M_current = _Var8._M_current + -1;
          bVar12 = (*__comp._M_comp)(*(FieldDescriptor **)a,*ppFVar7);
        } while (bVar12);
        if (_Var8._M_current <= __first._M_current) break;
        pFVar3 = *__first._M_current;
        *__first._M_current = *_Var8._M_current;
        *_Var8._M_current = pFVar3;
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
                (__first,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                          )b,__depth_limit,__comp);
      uVar10 = lVar11 >> 3;
      b = (iterator *)__first._M_current;
      uVar5 = extraout_AL_00;
    } while (0x10 < (long)uVar10);
  }
  return (bool)uVar5;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }